

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

Validity * __thiscall kj::TestRunner::run(Validity *__return_storage_ptr__,TestRunner *this)

{
  char cVar1;
  _func_int **pp_Var2;
  ProcessContext *pPVar3;
  bool bVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  char (*params_1) [16];
  size_t sVar7;
  NullableValue<kj::Exception> *other;
  Exception *pEVar8;
  Type *func;
  Exception *params;
  char (*params_3) [6];
  char **in_stack_fffffffffffffa98;
  String *__return_storage_ptr___00;
  StringPtr local_4e8;
  String local_4d8;
  StringPtr local_4c0;
  StringPtr local_4b0;
  String local_4a0;
  StringPtr local_488;
  StringPtr local_478;
  StringPtr local_468;
  StringPtr local_458;
  StringPtr local_448;
  long local_438;
  long local_430;
  undefined1 local_428 [8];
  String message;
  TimePoint end;
  StringPtr local_3f0;
  TestRunner *local_3e0;
  ArrayDisposer **local_3d8;
  undefined1 *local_3d0;
  Maybe<kj::Exception> local_3c8;
  undefined1 local_268 [8];
  NullableValue<kj::Exception> exception;
  TimePoint start;
  undefined1 auStack_f8 [7];
  bool currentFailed;
  char (*local_f0) [6];
  undefined8 local_e0;
  StringPtr local_d8;
  undefined1 local_c1;
  long local_c0;
  undefined1 local_b8 [8];
  String name;
  TestCase *testCase_1;
  uint failCount;
  uint passCount;
  ArrayPtr<const_char> local_80;
  size_t local_70;
  size_t i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  TestCase *testCase;
  undefined1 local_28 [8];
  ArrayPtr<const_char> commonPrefix;
  TestRunner *this_local;
  
  commonPrefix.size_ = (size_t)this;
  if ((anonymous_namespace)::testCasesHead == (Range<unsigned_long> *)0x0) {
    MainBuilder::Validity::Validity(__return_storage_ptr__,"no tests were declared");
    return __return_storage_ptr__;
  }
  StringPtr::StringPtr((StringPtr *)&testCase,(char *)(anonymous_namespace)::testCasesHead->end_);
  _local_28 = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&testCase);
  __range3 = (anonymous_namespace)::testCasesHead;
  do {
    if (__range3 == (Range<unsigned_long> *)0x0) {
      while( true ) {
        params_1 = (char (*) [16])ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
        bVar4 = false;
        if (params_1 != (char (*) [16])0x0) {
          pcVar6 = ArrayPtr<const_char>::back((ArrayPtr<const_char> *)local_28);
          params_1 = (char (*) [16])(ulong)(uint)(int)*pcVar6;
          bVar4 = false;
          if ((int)*pcVar6 != 0x2f) {
            pcVar6 = ArrayPtr<const_char>::back((ArrayPtr<const_char> *)local_28);
            bVar4 = *pcVar6 != '\\';
          }
        }
        if (!bVar4) break;
        sVar7 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
        _failCount = ArrayPtr<const_char>::slice((ArrayPtr<const_char> *)local_28,0,sVar7 - 1);
        _local_28 = _failCount;
      }
      testCase_1._4_4_ = 0;
      testCase_1._0_4_ = 0;
      for (name.content.disposer = (ArrayDisposer *)(anonymous_namespace)::testCasesHead;
          name.content.disposer != (ArrayDisposer *)0x0;
          name.content.disposer = (ArrayDisposer *)name.content.disposer[4]._vptr_ArrayDisposer) {
        if (((this->hasFilter & 1U) == 0) ||
           (((ulong)name.content.disposer[6]._vptr_ArrayDisposer & 1) != 0)) {
          pp_Var2 = name.content.disposer[1]._vptr_ArrayDisposer;
          sVar7 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
          local_c0 = (long)pp_Var2 + sVar7;
          local_c1 = 0x3a;
          str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
                    ((String *)local_b8,(kj *)&local_c0,(char **)&local_c1,
                     (char *)(name.content.disposer + 2),(uint *)0x679aee,
                     (char (*) [3])(name.content.disposer + 3),in_stack_fffffffffffffa98);
          StringPtr::StringPtr(&local_d8,"[ TEST ]");
          StringPtr::StringPtr((StringPtr *)auStack_f8,(String *)local_b8);
          params_1 = (char (*) [16])local_d8.content.size_;
          params_3 = local_f0;
          write(this,2,local_d8.content.ptr,local_d8.content.size_);
          if ((this->listOnly & 1U) == 0) {
            start.value.value._7_1_ = 1;
            exception.field_1._336_8_ = anon_unknown_0::readClock();
            local_3d8 = &name.content.disposer;
            local_3d0 = (undefined1 *)((long)&start.value.value + 7);
            local_3e0 = this;
            runCatchingExceptions<kj::TestRunner::run()::_lambda()_1_>
                      (&local_3c8,(kj *)&local_3e0,func);
            other = _::readMaybe<kj::Exception>(&local_3c8);
            _::NullableValue<kj::Exception>::NullableValue
                      ((NullableValue<kj::Exception> *)local_268,other);
            Maybe<kj::Exception>::~Maybe(&local_3c8);
            pEVar8 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_268);
            if (pEVar8 != (Exception *)0x0) {
              pPVar3 = this->context;
              pEVar8 = _::NullableValue<kj::Exception>::operator*
                                 ((NullableValue<kj::Exception> *)local_268);
              str<kj::Exception&>((String *)&end,(kj *)pEVar8,params);
              StringPtr::StringPtr(&local_3f0,(String *)&end);
              (*pPVar3->_vptr_ProcessContext[3])
                        (pPVar3,local_3f0.content.ptr,local_3f0.content.size_);
              String::~String((String *)&end);
            }
            _::NullableValue<kj::Exception>::~NullableValue
                      ((NullableValue<kj::Exception> *)local_268);
            message.content.disposer = (ArrayDisposer *)anon_unknown_0::readClock();
            local_438 = (long)Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
                              ::operator-((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
                                           *)&message.content.disposer,
                                          (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
                                           *)((long)&exception.field_1 + 0x150));
            local_430 = Quantity<long,kj::_::NanosecondLabel>::operator/
                                  ((Quantity<long,kj::_::NanosecondLabel> *)&local_438,
                                   (Quantity<long,_kj::_::NanosecondLabel> *)&MICROSECONDS);
            str<kj::String&,char_const(&)[3],long,char_const(&)[6]>
                      ((String *)local_428,(kj *)local_b8,(String *)" (",(char (*) [3])&local_430,
                       (long *)anon_var_dwarf_3709f9,params_3);
            if ((start.value.value._7_1_ & 1) == 0) {
              StringPtr::StringPtr(&local_468,"[ PASS ]");
              StringPtr::StringPtr(&local_478,(String *)local_428);
              params_1 = (char (*) [16])local_468.content.size_;
              write(this,1,local_468.content.ptr,local_468.content.size_);
              testCase_1._4_4_ = testCase_1._4_4_ + 1;
            }
            else {
              StringPtr::StringPtr(&local_448,"[ FAIL ]");
              StringPtr::StringPtr(&local_458,(String *)local_428);
              params_1 = (char (*) [16])local_448.content.size_;
              write(this,0,local_448.content.ptr,local_448.content.size_);
              testCase_1._0_4_ = (int)testCase_1 + 1;
            }
            String::~String((String *)local_428);
          }
          String::~String((String *)local_b8);
        }
      }
      if (testCase_1._4_4_ != 0) {
        str<unsigned_int&,char_const(&)[16]>
                  (&local_4a0,(kj *)((long)&testCase_1 + 4),(uint *)" test(s) passed",params_1);
        StringPtr::StringPtr(&local_488,&local_4a0);
        StringPtr::StringPtr(&local_4b0,"");
        write(this,1,local_488.content.ptr,local_488.content.size_);
        String::~String(&local_4a0);
        params_1 = (char (*) [16])local_488.content.size_;
      }
      if ((int)testCase_1 != 0) {
        __return_storage_ptr___00 = &local_4d8;
        str<unsigned_int&,char_const(&)[16]>
                  (__return_storage_ptr___00,(kj *)&testCase_1,(uint *)" test(s) failed",params_1);
        StringPtr::StringPtr(&local_4c0,__return_storage_ptr___00);
        StringPtr::StringPtr(&local_4e8,"");
        write(this,0,local_4c0.content.ptr,local_4c0.content.size_);
        String::~String(&local_4d8);
      }
      (*this->context->_vptr_ProcessContext[1])();
      _Unwind_Resume(local_e0);
    }
    ___begin3 = indices<kj::ArrayPtr<char_const>&>((ArrayPtr<const_char> *)local_28);
    __end3 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar4 = Range<unsigned_long>::Iterator::operator!=(&__end3,(Iterator *)&i), bVar4) {
      puVar5 = Range<unsigned_long>::Iterator::operator*(&__end3);
      local_70 = *puVar5;
      cVar1 = *(char *)(__range3->end_ + local_70);
      pcVar6 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)local_28,local_70);
      if (cVar1 != *pcVar6) {
        local_80 = ArrayPtr<const_char>::slice((ArrayPtr<const_char> *)local_28,0,local_70);
        _local_28 = local_80;
        break;
      }
      Range<unsigned_long>::Iterator::operator++(&__end3);
    }
    __range3 = (Range<unsigned_long> *)__range3[2].begin_;
  } while( true );
}

Assistant:

MainBuilder::Validity run() {
    if (testCasesHead == nullptr) {
      return "no tests were declared";
    }

    // Find the common path prefix of all filenames, so we can strip it off.
    ArrayPtr<const char> commonPrefix = StringPtr(testCasesHead->file);
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      for (size_t i: kj::indices(commonPrefix)) {
        if (testCase->file[i] != commonPrefix[i]) {
          commonPrefix = commonPrefix.slice(0, i);
          break;
        }
      }
    }

    // Back off the prefix to the last '/'.
    while (commonPrefix.size() > 0 && commonPrefix.back() != '/' && commonPrefix.back() != '\\') {
      commonPrefix = commonPrefix.slice(0, commonPrefix.size() - 1);
    }

    // Run the testts.
    uint passCount = 0;
    uint failCount = 0;
    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!hasFilter || testCase->matchedFilter) {
        auto name = kj::str(testCase->file + commonPrefix.size(), ':', testCase->line,
                            ": ", testCase->description);

        write(BLUE, "[ TEST ]", name);

        if (!listOnly) {
          bool currentFailed = true;
          auto start = readClock();
          KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
            TestExceptionCallback exceptionCallback(context);
            testCase->run();
            currentFailed = exceptionCallback.failed();
          })) {
            context.error(kj::str(*exception));
          }
          auto end = readClock();

          auto message = kj::str(name, " (", (end - start) / kj::MICROSECONDS, " μs)");

          if (currentFailed) {
            write(RED, "[ FAIL ]", message);
            ++failCount;
          } else {
            write(GREEN, "[ PASS ]", message);
            ++passCount;
          }
        }
      }
    }

    if (passCount > 0) write(GREEN, kj::str(passCount, " test(s) passed"), "");
    if (failCount > 0) write(RED, kj::str(failCount, " test(s) failed"), "");
    context.exit();

    KJ_UNREACHABLE;
  }